

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O2

void __thiscall QDataWidgetMapperPrivate::commitData(QDataWidgetMapperPrivate *this,QWidget *w)

{
  int iVar1;
  reference m;
  
  if (this->submitPolicy != ManualSubmit) {
    iVar1 = findWidget(this,w);
    if (iVar1 != -1) {
      m = std::
          vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
          ::operator[](&this->widgetMap,(long)iVar1);
      commit(this,m);
      return;
    }
  }
  return;
}

Assistant:

void QDataWidgetMapperPrivate::commitData(QWidget *w)
{
    if (submitPolicy == QDataWidgetMapper::ManualSubmit)
        return;

    int idx = findWidget(w);
    if (idx == -1)
        return; // not our widget

    commit(widgetMap[idx]);
}